

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_zstd.c
# Opt level: O0

int archive_compressor_zstd_options(archive_write_filter *f,char *key,char *value)

{
  int iVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  int max_distance;
  ZSTD_bounds bounds;
  intmax_t long_distance;
  intmax_t threads;
  int maximum;
  int minimum;
  intmax_t level;
  private_data_conflict9 *data;
  char *value_local;
  char *key_local;
  archive_write_filter *f_local;
  
  level = (intmax_t)f->data;
  data = (private_data_conflict9 *)value;
  value_local = key;
  key_local = (char *)f;
  iVar1 = strcmp(key,"compression-level");
  if (iVar1 == 0) {
    iVar1 = string_to_number((char *)data,(intmax_t *)&maximum);
    if (iVar1 == 0) {
      threads._4_4_ = -99;
      threads._0_4_ = 0x16;
      threads._0_4_ = ZSTD_maxCLevel();
      uVar2 = ZSTD_versionNumber();
      if (uVar2 < 0x2842) {
        uVar2 = ZSTD_versionNumber();
        if (uVar2 < 0x2840) {
          threads._4_4_ = 0;
        }
      }
      else {
        threads._4_4_ = ZSTD_minCLevel();
      }
      if ((_maximum < threads._4_4_) || ((int)threads < _maximum)) {
        f_local._4_4_ = -0x14;
      }
      else {
        *(int *)level = (int)_maximum;
        f_local._4_4_ = 0;
      }
    }
    else {
      f_local._4_4_ = -0x14;
    }
  }
  else {
    iVar1 = strcmp(value_local,"threads");
    if (iVar1 == 0) {
      iVar1 = string_to_number((char *)data,&long_distance);
      if (iVar1 == 0) {
        if (long_distance == 0) {
          long_distance = sysconf(0x54);
        }
        if ((long_distance < 0) || (0x7fffffff < long_distance)) {
          f_local._4_4_ = -0x14;
        }
        else {
          *(int *)(level + 4) = (int)long_distance;
          f_local._4_4_ = 0;
        }
      }
      else {
        f_local._4_4_ = -0x14;
      }
    }
    else {
      iVar1 = strcmp(value_local,"frame-per-file");
      if (iVar1 == 0) {
        *(undefined4 *)(level + 0x10) = 1;
        f_local._4_4_ = 0;
      }
      else {
        iVar1 = strcmp(value_local,"min-frame-in");
        if (iVar1 == 0) {
          iVar1 = string_to_size((char *)data,(size_t *)(level + 0x18));
          if (iVar1 == 0) {
            f_local._4_4_ = 0;
          }
          else {
            f_local._4_4_ = -0x14;
          }
        }
        else {
          iVar1 = strcmp(value_local,"min-frame-out");
          if ((iVar1 == 0) || (iVar1 = strcmp(value_local,"min-frame-size"), iVar1 == 0)) {
            iVar1 = string_to_size((char *)data,(size_t *)(level + 0x28));
            if (iVar1 == 0) {
              f_local._4_4_ = 0;
            }
            else {
              f_local._4_4_ = -0x14;
            }
          }
          else {
            iVar1 = strcmp(value_local,"max-frame-in");
            if ((iVar1 == 0) || (iVar1 = strcmp(value_local,"max-frame-size"), iVar1 == 0)) {
              iVar1 = string_to_size((char *)data,(size_t *)(level + 0x20));
              if ((iVar1 == 0) && (0x3ff < *(ulong *)(level + 0x20))) {
                f_local._4_4_ = 0;
              }
              else {
                f_local._4_4_ = -0x14;
              }
            }
            else {
              iVar1 = strcmp(value_local,"max-frame-out");
              if (iVar1 == 0) {
                iVar1 = string_to_size((char *)data,(size_t *)(level + 0x30));
                if ((iVar1 == 0) && (0x3ff < *(ulong *)(level + 0x30))) {
                  f_local._4_4_ = 0;
                }
                else {
                  f_local._4_4_ = -0x14;
                }
              }
              else {
                iVar1 = strcmp(value_local,"long");
                if (iVar1 == 0) {
                  iVar1 = string_to_number((char *)data,(intmax_t *)&bounds.lowerBound);
                  if (iVar1 == 0) {
                    auVar3 = ZSTD_cParam_getBounds(0x65);
                    bounds.error = auVar3._8_8_;
                    iVar1 = ZSTD_isError(auVar3._0_8_);
                    if (iVar1 == 0) {
                      if ((bounds.lowerBound < (int)bounds.error) ||
                         (bounds.error._4_4_ < bounds.lowerBound)) {
                        return -0x14;
                      }
                    }
                    else if ((bounds.lowerBound < 10) || (0x1f < bounds.lowerBound)) {
                      return -0x14;
                    }
                    *(int *)(level + 8) = bounds.lowerBound;
                    f_local._4_4_ = 0;
                  }
                  else {
                    f_local._4_4_ = -0x14;
                  }
                }
                else {
                  f_local._4_4_ = -0x14;
                }
              }
            }
          }
        }
      }
    }
  }
  return f_local._4_4_;
}

Assistant:

static int
archive_compressor_zstd_options(struct archive_write_filter *f, const char *key,
    const char *value)
{
	struct private_data *data = (struct private_data *)f->data;

	if (strcmp(key, "compression-level") == 0) {
		intmax_t level;
		if (string_to_number(value, &level) != ARCHIVE_OK) {
			return (ARCHIVE_WARN);
		}
		/* If we don't have the library, hard-code the max level */
		int minimum = CLEVEL_MIN;
		int maximum = CLEVEL_MAX;
#if HAVE_ZSTD_H && HAVE_ZSTD_compressStream
		maximum = ZSTD_maxCLevel();
#if ZSTD_VERSION_NUMBER >= MINVER_MINCLEVEL
		if (ZSTD_versionNumber() >= MINVER_MINCLEVEL) {
			minimum = ZSTD_minCLevel();
		}
		else
#endif
		if (ZSTD_versionNumber() < MINVER_NEGCLEVEL) {
			minimum = CLEVEL_STD_MIN;
		}
#endif
		if (level < minimum || level > maximum) {
			return (ARCHIVE_WARN);
		}
		data->compression_level = (int)level;
		return (ARCHIVE_OK);
	} else if (strcmp(key, "threads") == 0) {
		intmax_t threads;
		if (string_to_number(value, &threads) != ARCHIVE_OK) {
			return (ARCHIVE_WARN);
		}

#if defined(HAVE_SYSCONF) && defined(_SC_NPROCESSORS_ONLN)
		if (threads == 0) {
			threads = sysconf(_SC_NPROCESSORS_ONLN);
		}
#elif !defined(__CYGWIN__) && defined(_WIN32_WINNT) && \
    _WIN32_WINNT >= 0x0601 /* _WIN32_WINNT_WIN7 */
		if (threads == 0) {
			DWORD winCores = GetActiveProcessorCount(
			    ALL_PROCESSOR_GROUPS);
			threads = (intmax_t)winCores;
		}
#endif
		if (threads < 0 || threads > INT_MAX) {
			return (ARCHIVE_WARN);
		}
		data->threads = (int)threads;
		return (ARCHIVE_OK);
#if HAVE_ZSTD_H && HAVE_ZSTD_compressStream
	} else if (strcmp(key, "frame-per-file") == 0) {
		data->frame_per_file = 1;
		return (ARCHIVE_OK);
	} else if (strcmp(key, "min-frame-in") == 0) {
		if (string_to_size(value, &data->min_frame_in) != ARCHIVE_OK) {
			return (ARCHIVE_WARN);
		}
		return (ARCHIVE_OK);
	} else if (strcmp(key, "min-frame-out") == 0 ||
	    strcmp(key, "min-frame-size") == 0) {
		if (string_to_size(value, &data->min_frame_out) != ARCHIVE_OK) {
			return (ARCHIVE_WARN);
		}
		return (ARCHIVE_OK);
	} else if (strcmp(key, "max-frame-in") == 0 ||
	    strcmp(key, "max-frame-size") == 0) {
		if (string_to_size(value, &data->max_frame_in) != ARCHIVE_OK ||
		    data->max_frame_in < 1024) {
			return (ARCHIVE_WARN);
		}
		return (ARCHIVE_OK);
	} else if (strcmp(key, "max-frame-out") == 0) {
		if (string_to_size(value, &data->max_frame_out) != ARCHIVE_OK ||
		    data->max_frame_out < 1024) {
			return (ARCHIVE_WARN);
		}
		return (ARCHIVE_OK);
#endif
	}
	else if (strcmp(key, "long") == 0) {
		intmax_t long_distance;
		if (string_to_number(value, &long_distance) != ARCHIVE_OK) {
			return (ARCHIVE_WARN);
		}
#if HAVE_ZSTD_H && HAVE_ZSTD_compressStream && ZSTD_VERSION_NUMBER >= MINVER_LONG
		ZSTD_bounds bounds = ZSTD_cParam_getBounds(ZSTD_c_windowLog);
		if (ZSTD_isError(bounds.error)) {
			int max_distance = ((int)(sizeof(size_t) == 4 ? 30 : 31));
			if (((int)long_distance) < 10 || (int)long_distance > max_distance)
				return (ARCHIVE_WARN);
		} else {
			if ((int)long_distance < bounds.lowerBound || (int)long_distance > bounds.upperBound)
				return (ARCHIVE_WARN);
		}
#else
		int max_distance = ((int)(sizeof(size_t) == 4 ? 30 : 31));
		if (((int)long_distance) < 10 || (int)long_distance > max_distance)
		    return (ARCHIVE_WARN);
#endif
		data->long_distance = (int)long_distance;
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}